

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_dosetbounds(_glist *x,int x1,int y1,int x2,int y2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  t_object *ptVar4;
  float fVar5;
  t_gobj *local_38;
  t_gobj *y;
  t_float diff;
  int heightchange;
  int heightwas;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  _glist *x_local;
  
  iVar1 = x->gl_screeny2;
  iVar2 = x->gl_screeny1;
  if ((((x->gl_screenx1 != x1) || (x->gl_screeny1 != y1)) || (x->gl_screenx2 != x2)) ||
     (x->gl_screeny2 != y2)) {
    x->gl_screenx1 = x1;
    x->gl_screeny1 = y1;
    x->gl_screenx2 = x2;
    x->gl_screeny2 = y2;
    iVar3 = glist_isgraph(x);
    if ((iVar3 == 0) && (x->gl_y2 < x->gl_y1)) {
      fVar5 = x->gl_y1 - x->gl_y2;
      x->gl_y1 = ((float)(y2 - y1) * fVar5) / (float)x->gl_zoom;
      x->gl_y2 = x->gl_y1 - fVar5;
      for (local_38 = x->gl_list; local_38 != (t_gobj *)0x0; local_38 = local_38->g_next) {
        ptVar4 = pd_checkobject(&local_38->g_pd);
        if (ptVar4 != (t_object *)0x0) {
          gobj_displace(local_38,x,0,((y2 - y1) - (iVar1 - iVar2)) / x->gl_zoom);
        }
      }
      canvas_redraw(x);
    }
  }
  return;
}

Assistant:

static void canvas_dosetbounds(t_canvas *x, int x1, int y1, int x2, int y2)
{
    int heightwas = y2 - y1;
    int heightchange = y2 - y1 - (x->gl_screeny2 - x->gl_screeny1);
    if (x->gl_screenx1 == x1 && x->gl_screeny1 == y1 &&
        x->gl_screenx2 == x2 && x->gl_screeny2 == y2)
            return;
    x->gl_screenx1 = x1;
    x->gl_screeny1 = y1;
    x->gl_screenx2 = x2;
    x->gl_screeny2 = y2;
    if (!glist_isgraph(x) && (x->gl_y2 < x->gl_y1))
    {
            /* if it's flipped so that y grows upward,
            fix so that zero is bottom edge and redraw.  This is
            only appropriate if we're a regular "text" object on the
            parent. */
        t_float diff = x->gl_y1 - x->gl_y2;
        t_gobj *y;
        x->gl_y1 = heightwas * diff/x->gl_zoom;
        x->gl_y2 = x->gl_y1 - diff;
            /* and move text objects accordingly; they should stick
            to the bottom, not the top. */
        for (y = x->gl_list; y; y = y->g_next)
            if (pd_checkobject(&y->g_pd))
                gobj_displace(y, x, 0, heightchange/x->gl_zoom);
        canvas_redraw(x);
    }
}